

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Zp_field.h
# Opt level: O0

Element_conflict
Gudhi::persistence_fields::Zp_field_element<13u,unsigned_int,void>::_get_value<int,void>(int e)

{
  undefined4 local_14;
  undefined4 local_10;
  undefined4 local_c;
  int e_local;
  
  local_10 = e;
  if (e < -0xd) {
    local_10 = (uint)e % 0xd;
  }
  if ((int)local_10 < 0) {
    local_c = local_10 + 0xd;
  }
  else {
    if ((int)local_10 < 0xd) {
      local_14 = local_10;
    }
    else {
      local_14 = local_10 % 0xd;
    }
    local_c = local_14;
  }
  return local_c;
}

Assistant:

static constexpr Element _get_value(Integer_type e) {
    if constexpr (std::is_signed_v<Integer_type>) {
      if (e < -static_cast<Integer_type>(characteristic)) e = e % characteristic;
      if (e < 0) return e += characteristic;
      return e < static_cast<Integer_type>(characteristic) ? e : e % characteristic;
    } else {
      return e < characteristic ? e : e % characteristic;
    }
  }